

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_io.cpp
# Opt level: O3

UEnumeration * ucnv_openAllNames_63(UErrorCode *pErrorCode)

{
  UBool UVar1;
  UEnumeration *buffer;
  undefined2 *puVar2;
  
  UVar1 = haveAliasData(pErrorCode);
  if (UVar1 != '\0') {
    buffer = (UEnumeration *)uprv_malloc_63(0x38);
    if (buffer == (UEnumeration *)0x0) {
      *pErrorCode = U_MEMORY_ALLOCATION_ERROR;
    }
    else {
      buffer->reset = ucnv_io_resetAllConverters;
      buffer->uNext = uenum_unextDefault_63;
      buffer->next = ucnv_io_nextAllConverters;
      buffer->close = ucnv_io_closeUEnumeration;
      buffer->count = ucnv_io_countAllConverters;
      buffer->baseContext = (void *)0x0;
      buffer->context = (void *)0x0;
      puVar2 = (undefined2 *)uprv_malloc_63(2);
      if (puVar2 != (undefined2 *)0x0) {
        *puVar2 = 0;
        buffer->context = puVar2;
        return buffer;
      }
      *pErrorCode = U_MEMORY_ALLOCATION_ERROR;
      uprv_free_63(buffer);
    }
  }
  return (UEnumeration *)0x0;
}

Assistant:

U_CAPI UEnumeration * U_EXPORT2
ucnv_openAllNames(UErrorCode *pErrorCode) {
    UEnumeration *myEnum = NULL;
    if (haveAliasData(pErrorCode)) {
        uint16_t *myContext;

        myEnum = static_cast<UEnumeration *>(uprv_malloc(sizeof(UEnumeration)));
        if (myEnum == NULL) {
            *pErrorCode = U_MEMORY_ALLOCATION_ERROR;
            return NULL;
        }
        uprv_memcpy(myEnum, &gEnumAllConverters, sizeof(UEnumeration));
        myContext = static_cast<uint16_t *>(uprv_malloc(sizeof(uint16_t)));
        if (myContext == NULL) {
            *pErrorCode = U_MEMORY_ALLOCATION_ERROR;
            uprv_free(myEnum);
            return NULL;
        }
        *myContext = 0;
        myEnum->context = myContext;
    }
    return myEnum;
}